

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void Search::get_training_timesteps(search_private *priv,v_array<unsigned_long> *timesteps)

{
  float *pfVar1;
  pair<float,_unsigned_long> *ppVar2;
  v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *pvVar3;
  bool bVar4;
  size_t in_RAX;
  ulong uVar5;
  uint uVar6;
  pair<COST_SENSITIVE::wclass_&,_bool> *ppVar7;
  byte bVar8;
  uint uVar9;
  long lVar10;
  size_t i;
  float fVar11;
  size_t t;
  
  t = in_RAX;
  v_array<unsigned_long>::clear(timesteps);
  fVar11 = priv->subsample_timesteps;
  if (fVar11 <= -1.0) {
    lVar10 = 8;
    for (uVar5 = 0;
        uVar5 < (ulong)((long)(priv->active_uncertainty)._end -
                        (long)(priv->active_uncertainty)._begin >> 4); uVar5 = uVar5 + 1) {
      fVar11 = merand48(&priv->all->random_state);
      ppVar2 = (priv->active_uncertainty)._begin;
      pfVar1 = (float *)((long)ppVar2 + lVar10 + -8);
      if (*pfVar1 <= fVar11 && fVar11 != *pfVar1) {
        t = *(long *)((long)&ppVar2->first + lVar10) - 1;
        v_array<unsigned_long>::push_back(timesteps,&t);
      }
      lVar10 = lVar10 + 0x10;
    }
  }
  else if (fVar11 <= 0.0) {
    for (t = 0; t < priv->T; t = t + 1) {
      if ((priv->active_csoaa == true) &&
         (pvVar3 = (priv->active_known)._begin,
         t < (ulong)((long)(priv->active_known)._end - (long)pvVar3 >> 5))) {
        ppVar7 = pvVar3[t]._begin;
        uVar6 = 0;
        do {
          if (ppVar7 == pvVar3[t]._end) break;
          bVar8 = ppVar7->second & 1;
          uVar9 = uVar6 + 1;
          if (bVar8 != 0) {
            uVar6 = uVar9;
          }
          ppVar7 = ppVar7 + 1;
        } while ((1 < uVar9 & bVar8) != 1);
        if (1 < uVar6) goto LAB_00215b1d;
      }
      else {
LAB_00215b1d:
        v_array<unsigned_long>::push_back(timesteps,&t);
      }
    }
  }
  else if (1.0 <= fVar11) {
    while( true ) {
      uVar5 = (long)timesteps->_end - (long)timesteps->_begin >> 3;
      if (((ulong)((long)(fVar11 - 9.223372e+18) & (long)fVar11 >> 0x3f | (long)fVar11) <= uVar5) ||
         (priv->T <= uVar5)) break;
      fVar11 = merand48(&priv->all->random_state);
      fVar11 = fVar11 * (float)priv->T;
      uVar5 = (ulong)fVar11;
      t = (long)(fVar11 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
      bVar4 = v_array_contains<unsigned_long>(timesteps,t);
      if (!bVar4) {
        v_array<unsigned_long>::push_back(timesteps,&t);
      }
      fVar11 = priv->subsample_timesteps;
    }
    std::
    __sort<unsigned_long*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(unsigned_long,unsigned_long)>>
              (timesteps->_begin,timesteps->_end,
               (_Iter_comp_iter<bool_(*)(unsigned_long,_unsigned_long)>)0x21b4c9);
  }
  else {
    for (t = 0; t < priv->T; t = t + 1) {
      fVar11 = merand48(&priv->all->random_state);
      if (fVar11 <= priv->subsample_timesteps) {
        v_array<unsigned_long>::push_back(timesteps,&t);
      }
    }
    if (timesteps->_end == timesteps->_begin) {
      fVar11 = merand48(&priv->all->random_state);
      fVar11 = fVar11 * (float)priv->T;
      uVar5 = (ulong)fVar11;
      t = (long)(fVar11 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
      v_array<unsigned_long>::push_back(timesteps,&t);
    }
  }
  if (priv->linear_ordering == false) {
    hoopla_permute(timesteps->_begin,timesteps->_end);
  }
  return;
}

Assistant:

void get_training_timesteps(search_private& priv, v_array<size_t>& timesteps)
{
  timesteps.clear();

  // if there's active learning, we need to
  if (priv.subsample_timesteps <= -1)
  {
    for (size_t i = 0; i < priv.active_uncertainty.size(); i++)
      if (merand48(priv.all->random_state) > priv.active_uncertainty[i].first)
        timesteps.push_back(priv.active_uncertainty[i].second - 1);
    /*
    float k = (float)priv.total_examples_generated;
    priv.ec_seq[t]->revert_weight = priv.all->loss->getRevertingWeight(priv.all->sd, priv.ec_seq[t].pred.scalar,
    priv.all->eta / powf(k, priv.all->power_t)); float importance = query_decision(active_str, *priv.ec_seq[t], k); if
    (importance > 0.) timesteps.push_back(pair<size_t,size_t>(0,t));
    */
  }
  // if there's no subsampling to do, just return [0,T)
  else if (priv.subsample_timesteps <= 0)
    for (size_t t = 0; t < priv.T; t++)
    {
      uint32_t count = 99;
      if (priv.active_csoaa && (t < priv.active_known.size()))
      {
        count = 0;
        for (pair<CS::wclass&, bool> wcq : priv.active_known[t])
          if (wcq.second)
          {
            count++;
            if (count > 1)
              break;
          }
      }
      if (count > 1)
        timesteps.push_back(t);
    }

  // if subsample in (0,1) then pick steps with that probability, but ensuring there's at least one!
  else if (priv.subsample_timesteps < 1)
  {
    for (size_t t = 0; t < priv.T; t++)
      if (merand48(priv.all->random_state) <= priv.subsample_timesteps)
        timesteps.push_back(t);

    if (timesteps.size() == 0)  // ensure at least one
      timesteps.push_back((size_t)(merand48(priv.all->random_state) * priv.T));
  }

  // finally, if subsample >= 1, then pick (int) that many uniformly at random without replacement; could use an LFSR
  // but why? :P
  else
  {
    while ((timesteps.size() < (size_t)priv.subsample_timesteps) && (timesteps.size() < priv.T))
    {
      size_t t = (size_t)(merand48(priv.all->random_state) * (float)priv.T);
      if (!v_array_contains(timesteps, t))
        timesteps.push_back(t);
    }
    std::sort(timesteps.begin(), timesteps.end(), cmp_size_t);
  }

  if (!priv.linear_ordering)
    hoopla_permute(timesteps.begin(), timesteps.end());
}